

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O0

void av1_estimate_intra_mode
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int best_early_term,uint ref_cost_intra
               ,int reuse_prediction,buf_2d *orig_dst,PRED_BUFFER *tmp_buffers,
               PRED_BUFFER **this_mode_pred,RD_STATS *best_rdc,BEST_PICKMODE *best_pickmode,
               PICK_MODE_CONTEXT *ctx,uint *best_sad_norm)

{
  byte bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  byte bVar4;
  undefined2 uVar5;
  MB_MODE_INFO *pMVar6;
  long lVar7;
  bool bVar8;
  _Bool _Var9;
  int iVar10;
  int iVar11;
  MACROBLOCK *x_00;
  uint8_t *puVar12;
  int in_ECX;
  BLOCK_SIZE in_DL;
  MACROBLOCK *in_RSI;
  AV1_COMP *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar13;
  long *in_stack_00000008;
  PRED_BUFFER *in_stack_00000010;
  long *in_stack_00000018;
  void *in_stack_00000020;
  long *in_stack_00000028;
  int mode_cost;
  BLOCK_SIZE uv_bsize;
  int64_t mode_rd_thresh;
  THR_MODES mode_index;
  PREDICTION_MODE this_mode;
  int midx;
  int bw;
  int bh;
  PRED_BUFFER *best_pred;
  TX_SIZE intra_tx_size;
  estimate_block_intra_args args;
  int64_t known_rd;
  int motion_thresh;
  uint32_t spatial_var_thresh;
  int do_early_exit_rdthresh;
  int force_intra_check;
  int perform_intra_pred;
  int64_t inter_mode_thresh;
  int intra_cost_penalty;
  RD_STATS this_rdc;
  CommonQuantParams *quant_params;
  REAL_TIME_SPEED_FEATURES *rt_sf;
  macroblockd_plane *pd;
  _Bool is_screen_content;
  int *rd_thresh_freq_fact;
  int *rd_threshes;
  uchar segment_id;
  TxfmSearchParams *txfm_params;
  MB_MODE_INFO *mi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  TX_SIZE in_stack_00000bee;
  BLOCK_SIZE in_stack_00000bef;
  int *in_stack_00000bf0;
  RD_STATS *in_stack_00000bf8;
  MACROBLOCK *in_stack_00000c00;
  undefined8 in_stack_fffffffffffffea8;
  PRED_BUFFER *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  uint local_140;
  MACROBLOCK *local_138;
  uint in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed4;
  int local_128;
  int local_114;
  long *arg;
  undefined7 in_stack_ffffffffffffff00;
  TX_SIZE TVar14;
  int in_stack_ffffffffffffff08;
  BLOCK_SIZE in_stack_ffffffffffffff0f;
  MACROBLOCK *in_stack_ffffffffffffff10;
  uint local_d8;
  int local_c4;
  uint local_c0;
  int iVar15;
  int iVar16;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  long local_98;
  long local_90;
  uint8_t local_80;
  int local_18;
  
  pMVar6 = *(in_RSI->e_mbd).mi;
  uVar5 = *(undefined2 *)&pMVar6->field_0xa7;
  bVar13 = (in_RDI->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN;
  iVar10 = av1_get_intra_cost_penalty
                     ((int)in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20)
                      ,(aom_bit_depth_t)in_stack_fffffffffffffea8);
  x_00 = (MACROBLOCK *)((long)((ulong)(uint)(in_R8D + iVar10) * (long)in_RSI->rdmult + 0x100) >> 9);
  iVar16 = (in_RDI->sf).rt_sf.check_intra_pred_nonrd;
  iVar15 = 0;
  if ((((0 < (in_RDI->svc).spatial_layer_id) && (*(char *)((long)in_stack_00000028 + 0xb) != '\x04')
       ) && (0 < (in_RDI->svc).temporal_layer_id)) &&
     ((in_RDI->svc).layer_context[(in_RDI->svc).temporal_layer_id].is_key_frame == 0)) {
    iVar16 = 0;
  }
  bVar8 = true;
  local_c0 = 0x32;
  local_c4 = 0x20;
  if ((in_RDI->ppi->use_svc != 0) ||
     (((in_RDI->sf).rt_sf.use_nonrd_altref_frame == 0 &&
      (0 < (in_RDI->sf).rt_sf.nonrd_prune_ref_frame_search)))) {
    local_c0 = 0x96;
    local_c4 = 0;
  }
  local_18 = in_ECX;
  if (local_c0 <= in_RSI->source_variance) {
    if (((in_RDI->sf).rt_sf.source_metrics_sb_nonrd != 0) &&
       ((in_RSI->content_state_sb).source_sad_nonrd < kMedSad)) {
      iVar16 = 0;
    }
    goto LAB_002f0cbc;
  }
  if (*(long *)((long)in_stack_00000020 + 0x10) != 0x7fffffffffffffff) {
    if (*(char *)((long)in_stack_00000028 + 0xb) == '\x01') {
      iVar11 = (int)pMVar6->mv[0].as_mv.row;
      if (iVar11 < 1) {
        iVar11 = -iVar11;
      }
      if (iVar11 < local_c4) {
        iVar11 = (int)pMVar6->mv[0].as_mv.col;
        if (iVar11 < 1) {
          iVar11 = -iVar11;
        }
        if (iVar11 < local_c4) goto LAB_002f0bb1;
      }
    }
    iVar10 = iVar10 >> 2;
    x_00 = (MACROBLOCK *)
           ((long)((ulong)(uint)(in_R8D + iVar10) * (long)in_RSI->rdmult + 0x100) >> 9);
    bVar8 = false;
  }
LAB_002f0bb1:
  in_stack_fffffffffffffed4 = in_RSI->source_variance;
  if (local_c0 >> 1 < 0x32) {
    in_stack_fffffffffffffed0 = 0x32;
  }
  else {
    in_stack_fffffffffffffed0 = local_c0 >> 1;
  }
  if (((in_stack_fffffffffffffed4 < in_stack_fffffffffffffed0) &&
      (kMedSad < (in_RSI->content_state_sb).source_sad_nonrd)) ||
     (((bVar13 && (in_RSI->source_variance < 0x32)) &&
      ((((BLOCK_32X16 < in_DL && ((in_RSI->content_state_sb).source_sad_nonrd != kZeroSad)) ||
        (in_RSI->color_sensitivity[0] == '\x01')) || (in_RSI->color_sensitivity[1] == '\x01')))))) {
    iVar15 = 1;
  }
  if (BLOCK_32X16 < in_DL) {
    local_18 = 0;
  }
LAB_002f0cbc:
  if ((*(char *)((long)in_stack_00000020 + 0x20) != '\0') &&
     (*(char *)((long)in_stack_00000028 + 0xe) != '\0')) {
    if (((in_RDI->sf).rt_sf.skip_intra_pred == 1) && ((char)in_stack_00000028[1] != '\x10')) {
      iVar16 = 0;
    }
    else if ((in_RDI->sf).rt_sf.skip_intra_pred == 2) {
      iVar16 = 0;
    }
  }
  if (((*(long *)((long)in_stack_00000020 + 0x10) == 0x7fffffffffffffff) || (iVar15 != 0)) ||
     ((iVar16 != 0 && ((local_18 == 0 && (in_DL <= (in_RDI->sf).part_sf.max_intra_bsize)))))) {
    local_138 = x_00;
    if (bVar13) {
      local_138 = (MACROBLOCK *)((long)x_00 * 7 >> 3);
    }
    if ((long)local_138 <= *(long *)((long)in_stack_00000020 + 0x10)) {
      init_estimate_block_intra_args
                ((estimate_block_intra_args *)&stack0xffffffffffffff08,in_RDI,in_RSI);
      prune_palette_testing_inter(in_RDI,in_RSI->source_variance);
      if (""[in_DL] < ""[(in_RSI->txfm_search_params).tx_mode_search_type]) {
        bVar1 = ""[in_DL];
      }
      else {
        bVar1 = ""[(in_RSI->txfm_search_params).tx_mode_search_type];
      }
      if (bVar1 < 2) {
        if (""[in_DL] < ""[(in_RSI->txfm_search_params).tx_mode_search_type]) {
          bVar1 = ""[in_DL];
        }
        else {
          bVar1 = ""[(in_RSI->txfm_search_params).tx_mode_search_type];
        }
        local_140 = (uint)bVar1;
      }
      else {
        local_140 = 2;
      }
      TVar14 = (TX_SIZE)local_140;
      if ((((bVar13) && ((in_RDI->rc).high_source_sad != 0)) && (local_c0 < in_RSI->source_variance)
          ) && (in_DL < BLOCK_16X32)) {
        TVar14 = '\0';
      }
      arg = (long *)*in_stack_00000028;
      if ((in_R9D != 0) && (arg != (long *)0x0)) {
        uVar2 = block_size_high[in_DL];
        uVar3 = block_size_wide[in_DL];
        if (*arg == *in_stack_00000008) {
          iVar11 = get_pred_buffer(in_stack_00000010,3);
          *in_stack_00000018 = (long)(in_stack_00000010 + iVar11);
          (*aom_convolve_copy)
                    ((uint8_t *)*arg,(long)(int)arg[1],*(uint8_t **)*in_stack_00000018,
                     (long)*(int *)(*in_stack_00000018 + 8),(int)uVar3,(int)uVar2);
          *in_stack_00000028 = *in_stack_00000018;
          in_stack_fffffffffffffeb0 = in_stack_00000010;
        }
      }
      (in_RSI->e_mbd).plane[0].dst.buf = (uint8_t *)*in_stack_00000008;
      (in_RSI->e_mbd).plane[0].dst.buf0 = (uint8_t *)in_stack_00000008[1];
      lVar7 = in_stack_00000008[2];
      (in_RSI->e_mbd).plane[0].dst.width = (int)lVar7;
      (in_RSI->e_mbd).plane[0].dst.height = (int)((ulong)lVar7 >> 0x20);
      *(long *)&(in_RSI->e_mbd).plane[0].dst.stride = in_stack_00000008[3];
      for (local_114 = 0; local_114 < 4; local_114 = local_114 + 1) {
        bVar1 = ""[local_114];
        iVar11 = mode_offset(bVar1);
        bVar4 = mode_idx[0][iVar11];
        iVar11 = (in_RDI->rd).threshes[(byte)uVar5 & 7][in_DL][bVar4];
        puVar12 = in_RSI->color_sensitivity;
        _Var9 = is_prune_intra_mode((AV1_COMP *)CONCAT44(local_140,in_stack_fffffffffffffeb8),
                                    (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                                    (int)in_stack_fffffffffffffeb0,
                                    (BLOCK_SIZE)((ulong)puVar12 >> 0x38),
                                    (uint8_t)((ulong)puVar12 >> 0x30),(SOURCE_SAD)puVar12,
                                    (uint8_t *)
                                    CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        if ((!_Var9) &&
           ((((!bVar13 || ((in_RDI->sf).rt_sf.source_metrics_sb_nonrd == 0)) ||
             ((((in_RSI->content_state_sb).source_sad_nonrd != kZeroSad ||
               ((in_RSI->source_variance != 0 || (bVar1 == 0)))) &&
              ((in_DL < BLOCK_32X64 || (in_RSI->source_variance < 0x33)))))) &&
            ((iVar11 = rd_less_than_thresh(*(int64_t *)((long)in_stack_00000020 + 0x10),(long)iVar11
                                           ,in_RSI->thresh_freq_fact[in_DL][bVar4]), iVar11 == 0 ||
             ((!bVar8 && (bVar1 != 9)))))))) {
          get_plane_block_size
                    (in_DL,(in_RSI->e_mbd).plane[1].subsampling_x,
                     (in_RSI->e_mbd).plane[1].subsampling_y);
          pMVar6->mode = bVar1;
          pMVar6->ref_frame[0] = '\0';
          pMVar6->ref_frame[1] = -1;
          av1_invalid_rd_stats((RD_STATS *)&stack0xffffffffffffff60);
          pMVar6->tx_size = TVar14;
          compute_intra_yprediction
                    ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (PREDICTION_MODE)((uint)iVar10 >> 0x18),(BLOCK_SIZE)((uint)iVar10 >> 0x10),x_00
                     ,(MACROBLOCKD *)CONCAT44(iVar16,iVar15));
          av1_block_yrd(in_stack_00000c00,in_stack_00000bf8,in_stack_00000bf0,in_stack_00000bef,
                        in_stack_00000bee);
          if (in_RSI->color_sensitivity[0] != '\0') {
            av1_foreach_transformed_block_in_plane
                      ((MACROBLOCKD *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f,
                       in_stack_ffffffffffffff08,
                       (foreach_transformed_block_visitor)CONCAT17(TVar14,in_stack_ffffffffffffff00)
                       ,arg);
          }
          if (in_RSI->color_sensitivity[1] != '\0') {
            av1_foreach_transformed_block_in_plane
                      ((MACROBLOCKD *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f,
                       in_stack_ffffffffffffff08,
                       (foreach_transformed_block_visitor)CONCAT17(TVar14,in_stack_ffffffffffffff00)
                       ,arg);
          }
          local_128 = 0;
          iVar11 = av1_is_directional_mode(bVar1);
          if ((iVar11 != 0) && (iVar11 = av1_use_angle_delta(in_DL), iVar11 != 0)) {
            local_128 = (in_RSI->mode_costs).angle_delta_cost[(int)(bVar1 - 1)]
                        [pMVar6->angle_delta[0] + 3];
          }
          if ((bVar1 == 0) &&
             (iVar11 = av1_filter_intra_allowed_bsize(&in_RDI->common,in_DL), iVar11 != 0)) {
            local_128 = (in_RSI->mode_costs).filter_intra_cost[in_DL][0] + local_128;
          }
          in_stack_ffffffffffffff60 = local_128 + iVar10 + in_R8D + in_stack_ffffffffffffff60;
          local_90 = ((long)in_stack_ffffffffffffff60 * (long)in_RSI->rdmult + 0x100 >> 9) +
                     local_98 * 0x80;
          if ((bVar13) && ((in_RDI->sf).rt_sf.source_metrics_sb_nonrd != 0)) {
            if ((((in_RDI->rc).high_source_sad == 0) || (799 < in_RSI->source_variance)) ||
               ((in_RSI->color_sensitivity[0] == '\0' && (in_RSI->color_sensitivity[1] == '\0')))) {
              if ((((in_RDI->rc).high_source_sad == 0) &&
                  (((in_RSI->source_variance != 0 &&
                    ((in_RSI->content_state_sb).source_sad_nonrd == kZeroSad)) &&
                   (in_RSI->color_sensitivity[0] == '\0')))) &&
                 (in_RSI->color_sensitivity[1] == '\0')) {
                local_90 = local_90 * 3 >> 1;
              }
            }
            else {
              local_90 = local_90 * 7 >> 3;
            }
          }
          if (local_90 < *(long *)((long)in_stack_00000020 + 0x10)) {
            memcpy(in_stack_00000020,&stack0xffffffffffffff60,0x28);
            *(byte *)(in_stack_00000028 + 1) = bVar1;
            *(TX_SIZE *)((long)in_stack_00000028 + 9) = pMVar6->tx_size;
            *(undefined1 *)((long)in_stack_00000028 + 0xb) = 0;
            *(undefined1 *)((long)in_stack_00000028 + 0xc) = 0;
            *(uint8_t *)((long)in_stack_00000028 + 0xd) = local_80;
            pMVar6->uv_mode = bVar1;
            pMVar6->mv[0].as_int = 0x80008000;
            pMVar6->mv[1].as_int = 0x80008000;
            if (local_80 == '\0') {
              memset(*(void **)(_mode_cost + 0x118),0,(long)*(int *)(_mode_cost + 0x1a0));
            }
          }
        }
      }
      if (*(char *)((long)in_stack_00000028 + 0xb) == '\0') {
        memset(*(void **)(_mode_cost + 0x118),0,(long)*(int *)(_mode_cost + 0x1a0));
      }
      pMVar6->tx_size = *(TX_SIZE *)((long)in_stack_00000028 + 9);
      *(uint *)mode_rd_thresh = local_d8 >> (""[in_DL] + ""[in_DL] & 0x1f);
    }
  }
  return;
}

Assistant:

void av1_estimate_intra_mode(AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
                             int best_early_term, unsigned int ref_cost_intra,
                             int reuse_prediction, struct buf_2d *orig_dst,
                             PRED_BUFFER *tmp_buffers,
                             PRED_BUFFER **this_mode_pred, RD_STATS *best_rdc,
                             BEST_PICKMODE *best_pickmode,
                             PICK_MODE_CONTEXT *ctx,
                             unsigned int *best_sad_norm) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const unsigned char segment_id = mi->segment_id;
  const int *const rd_threshes = cpi->rd.threshes[segment_id][bsize];
  const int *const rd_thresh_freq_fact = x->thresh_freq_fact[bsize];
  const bool is_screen_content =
      cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  const REAL_TIME_SPEED_FEATURES *const rt_sf = &cpi->sf.rt_sf;

  const CommonQuantParams *quant_params = &cm->quant_params;

  RD_STATS this_rdc;

  int intra_cost_penalty = av1_get_intra_cost_penalty(
      quant_params->base_qindex, quant_params->y_dc_delta_q,
      cm->seq_params->bit_depth);
  int64_t inter_mode_thresh =
      RDCOST(x->rdmult, ref_cost_intra + intra_cost_penalty, 0);
  int perform_intra_pred = rt_sf->check_intra_pred_nonrd;
  int force_intra_check = 0;
  // For spatial enhancement layer: turn off intra prediction if the
  // previous spatial layer as golden ref is not chosen as best reference.
  // only do this for temporal enhancement layer and on non-key frames.
  if (cpi->svc.spatial_layer_id > 0 &&
      best_pickmode->best_ref_frame != GOLDEN_FRAME &&
      cpi->svc.temporal_layer_id > 0 &&
      !cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame)
    perform_intra_pred = 0;

  int do_early_exit_rdthresh = 1;

  uint32_t spatial_var_thresh = 50;
  int motion_thresh = 32;
  // Adjust thresholds to make intra mode likely tested if the other
  // references (golden, alt) are skipped/not checked. For now always
  // adjust for svc mode.
  if (cpi->ppi->use_svc || (rt_sf->use_nonrd_altref_frame == 0 &&
                            rt_sf->nonrd_prune_ref_frame_search > 0)) {
    spatial_var_thresh = 150;
    motion_thresh = 0;
  }

  // Some adjustments to checking intra mode based on source variance.
  if (x->source_variance < spatial_var_thresh) {
    // If the best inter mode is large motion or non-LAST ref reduce intra cost
    // penalty, so intra mode is more likely tested.
    if (best_rdc->rdcost != INT64_MAX &&
        (best_pickmode->best_ref_frame != LAST_FRAME ||
         abs(mi->mv[0].as_mv.row) >= motion_thresh ||
         abs(mi->mv[0].as_mv.col) >= motion_thresh)) {
      intra_cost_penalty = intra_cost_penalty >> 2;
      inter_mode_thresh =
          RDCOST(x->rdmult, ref_cost_intra + intra_cost_penalty, 0);
      do_early_exit_rdthresh = 0;
    }
    if ((x->source_variance < AOMMAX(50, (spatial_var_thresh >> 1)) &&
         x->content_state_sb.source_sad_nonrd >= kHighSad) ||
        (is_screen_content && x->source_variance < 50 &&
         ((bsize >= BLOCK_32X32 &&
           x->content_state_sb.source_sad_nonrd != kZeroSad) ||
          x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] == 1 ||
          x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] == 1)))
      force_intra_check = 1;
    // For big blocks worth checking intra (since only DC will be checked),
    // even if best_early_term is set.
    if (bsize >= BLOCK_32X32) best_early_term = 0;
  } else if (rt_sf->source_metrics_sb_nonrd &&
             x->content_state_sb.source_sad_nonrd <= kLowSad) {
    perform_intra_pred = 0;
  }

  if (best_rdc->skip_txfm && best_pickmode->best_mode_initial_skip_flag) {
    if (rt_sf->skip_intra_pred == 1 && best_pickmode->best_mode != NEWMV)
      perform_intra_pred = 0;
    else if (rt_sf->skip_intra_pred == 2)
      perform_intra_pred = 0;
  }

  if (!(best_rdc->rdcost == INT64_MAX || force_intra_check ||
        (perform_intra_pred && !best_early_term &&
         bsize <= cpi->sf.part_sf.max_intra_bsize))) {
    return;
  }

  // Early exit based on RD cost calculated using known rate. When
  // is_screen_content is true, more bias is given to intra modes. Hence,
  // considered conservative threshold in early exit for the same.
  const int64_t known_rd = is_screen_content
                               ? CALC_BIASED_RDCOST(inter_mode_thresh)
                               : inter_mode_thresh;
  if (known_rd > best_rdc->rdcost) return;

  struct estimate_block_intra_args args;
  init_estimate_block_intra_args(&args, cpi, x);
  if (prune_palette_testing_inter(cpi, x->source_variance))
    args.prune_palette_sad = true;
  TX_SIZE intra_tx_size = AOMMIN(
      AOMMIN(max_txsize_lookup[bsize],
             tx_mode_to_biggest_tx_size[txfm_params->tx_mode_search_type]),
      TX_16X16);
  if (is_screen_content && cpi->rc.high_source_sad &&
      x->source_variance > spatial_var_thresh && bsize <= BLOCK_16X16)
    intra_tx_size = TX_4X4;

  PRED_BUFFER *const best_pred = best_pickmode->best_pred;
  if (reuse_prediction && best_pred != NULL) {
    const int bh = block_size_high[bsize];
    const int bw = block_size_wide[bsize];
    if (best_pred->data == orig_dst->buf) {
      *this_mode_pred = &tmp_buffers[get_pred_buffer(tmp_buffers, 3)];
      aom_convolve_copy(best_pred->data, best_pred->stride,
                        (*this_mode_pred)->data, (*this_mode_pred)->stride, bw,
                        bh);
      best_pickmode->best_pred = *this_mode_pred;
    }
  }
  pd->dst = *orig_dst;

  for (int midx = 0; midx < RTC_INTRA_MODES; ++midx) {
    const PREDICTION_MODE this_mode = intra_mode_list[midx];
    const THR_MODES mode_index = mode_idx[INTRA_FRAME][mode_offset(this_mode)];
    const int64_t mode_rd_thresh = rd_threshes[mode_index];

    if (is_prune_intra_mode(cpi, midx, force_intra_check, bsize, segment_id,
                            x->content_state_sb.source_sad_nonrd,
                            x->color_sensitivity))
      continue;

    if (is_screen_content && rt_sf->source_metrics_sb_nonrd) {
      // For spatially flat blocks with zero motion only check
      // DC mode.
      if (x->content_state_sb.source_sad_nonrd == kZeroSad &&
          x->source_variance == 0 && this_mode != DC_PRED)
        continue;
      // Only test Intra for big blocks if spatial_variance is small.
      else if (bsize > BLOCK_32X32 && x->source_variance > 50)
        continue;
    }

    if (rd_less_than_thresh(best_rdc->rdcost, mode_rd_thresh,
                            rd_thresh_freq_fact[mode_index]) &&
        (do_early_exit_rdthresh || this_mode == SMOOTH_PRED)) {
      continue;
    }
    const BLOCK_SIZE uv_bsize =
        get_plane_block_size(bsize, xd->plane[AOM_PLANE_U].subsampling_x,
                             xd->plane[AOM_PLANE_U].subsampling_y);

    mi->mode = this_mode;
    mi->ref_frame[0] = INTRA_FRAME;
    mi->ref_frame[1] = NONE_FRAME;

    av1_invalid_rd_stats(&this_rdc);
    args.mode = this_mode;
    args.skippable = 1;
    args.rdc = &this_rdc;
    mi->tx_size = intra_tx_size;
    compute_intra_yprediction(cm, this_mode, bsize, x, xd);
    // Look into selecting tx_size here, based on prediction residual.
    av1_block_yrd(x, &this_rdc, &args.skippable, bsize, mi->tx_size);
    // TODO(kyslov@) Need to account for skippable
    if (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)]) {
      av1_foreach_transformed_block_in_plane(xd, uv_bsize, AOM_PLANE_U,
                                             av1_estimate_block_intra, &args);
    }
    if (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)]) {
      av1_foreach_transformed_block_in_plane(xd, uv_bsize, AOM_PLANE_V,
                                             av1_estimate_block_intra, &args);
    }

    int mode_cost = 0;
    if (av1_is_directional_mode(this_mode) && av1_use_angle_delta(bsize)) {
      mode_cost +=
          x->mode_costs.angle_delta_cost[this_mode - V_PRED]
                                        [MAX_ANGLE_DELTA +
                                         mi->angle_delta[PLANE_TYPE_Y]];
    }
    if (this_mode == DC_PRED && av1_filter_intra_allowed_bsize(cm, bsize)) {
      mode_cost += x->mode_costs.filter_intra_cost[bsize][0];
    }
    this_rdc.rate += ref_cost_intra;
    this_rdc.rate += intra_cost_penalty;
    this_rdc.rate += mode_cost;
    this_rdc.rdcost = RDCOST(x->rdmult, this_rdc.rate, this_rdc.dist);

    if (is_screen_content && rt_sf->source_metrics_sb_nonrd) {
      // For blocks with low spatial variance and color sad,
      // favor the intra-modes, only on scene/slide change.
      if (cpi->rc.high_source_sad && x->source_variance < 800 &&
          (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] ||
           x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)]))
        this_rdc.rdcost = CALC_BIASED_RDCOST(this_rdc.rdcost);
      // Otherwise bias against intra for blocks with zero
      // motion and no color, on non-scene/slide changes.
      else if (!cpi->rc.high_source_sad && x->source_variance > 0 &&
               x->content_state_sb.source_sad_nonrd == kZeroSad &&
               x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] == 0 &&
               x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] == 0)
        this_rdc.rdcost = (3 * this_rdc.rdcost) >> 1;
    }

    if (this_rdc.rdcost < best_rdc->rdcost) {
      *best_rdc = this_rdc;
      best_pickmode->best_mode = this_mode;
      best_pickmode->best_tx_size = mi->tx_size;
      best_pickmode->best_ref_frame = INTRA_FRAME;
      best_pickmode->best_second_ref_frame = NONE;
      best_pickmode->best_mode_skip_txfm = this_rdc.skip_txfm;
      mi->uv_mode = this_mode;
      mi->mv[0].as_int = INVALID_MV;
      mi->mv[1].as_int = INVALID_MV;
      if (!this_rdc.skip_txfm)
        memset(ctx->blk_skip, 0,
               sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
    }
  }
  if (best_pickmode->best_ref_frame == INTRA_FRAME)
    memset(ctx->blk_skip, 0,
           sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
  mi->tx_size = best_pickmode->best_tx_size;

  *best_sad_norm = args.best_sad >>
                   (b_width_log2_lookup[bsize] + b_height_log2_lookup[bsize]);
}